

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void google::RemoveLogSink(LogSink *destination)

{
  undefined8 *puVar1;
  int iVar2;
  __normal_iterator<google::LogSink_**,_std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>
  __dest;
  LogSink **ppLVar3;
  LogSink **ppLVar4;
  LogSink *local_20;
  
  local_20 = destination;
  iVar2 = pthread_rwlock_wrlock((pthread_rwlock_t *)LogDestination::sink_mutex_);
  puVar1 = LogDestination::sinks_;
  if (iVar2 == 0x23) {
    std::__throw_system_error(0x23);
  }
  if (LogDestination::sinks_ != (undefined8 *)0x0) {
    __dest = std::
             __remove_if<__gnu_cxx::__normal_iterator<google::LogSink**,std::vector<google::LogSink*,std::allocator<google::LogSink*>>>,__gnu_cxx::__ops::_Iter_equals_val<google::LogSink*const>>
                       ((LogSink **)*LogDestination::sinks_,(LogSink **)LogDestination::sinks_[1],
                        &local_20);
    ppLVar4 = (LogSink **)LogDestination::sinks_[1];
    if (__dest._M_current != ppLVar4) {
      ppLVar3 = ppLVar4;
      if (puVar1[1] - (long)ppLVar4 != 0) {
        memmove(__dest._M_current,ppLVar4,puVar1[1] - (long)ppLVar4);
        ppLVar3 = (LogSink **)puVar1[1];
      }
      ppLVar4 = __dest._M_current + ((long)ppLVar3 - (long)ppLVar4);
      if (ppLVar3 != ppLVar4) {
        puVar1[1] = ppLVar4;
      }
    }
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)LogDestination::sink_mutex_);
  return;
}

Assistant:

void RemoveLogSink(LogSink* destination) {
  LogDestination::RemoveLogSink(destination);
}